

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ResultBuilder * __thiscall
Catch::
ExpressionLhs<kp::tree<htmlcxx2::HTML::Node,std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>>::pre_order_iterator_const&>
::
captureExpression<(Catch::Internal::Operator)1,kp::tree<htmlcxx2::HTML::Node,std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>>::pre_order_iterator>
          (ExpressionLhs<kp::tree<htmlcxx2::HTML::Node,std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>>::pre_order_iterator_const&>
           *this,pre_order_iterator *rhs)

{
  bool result;
  ResultBuilder *pRVar1;
  char *__s;
  pre_order_iterator *value;
  pre_order_iterator *value_00;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_38;
  Catch *local_18;
  pre_order_iterator *rhs_local;
  ExpressionLhs<const_kp::tree<htmlcxx2::HTML::Node,_std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>_>_>::pre_order_iterator_&>
  *this_local;
  
  pRVar1 = *(ResultBuilder **)this;
  local_18 = (Catch *)rhs;
  rhs_local = (pre_order_iterator *)this;
  result = Internal::
           compare<(Catch::Internal::Operator)1,kp::tree<htmlcxx2::HTML::Node,std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>>::pre_order_iterator,kp::tree<htmlcxx2::HTML::Node,std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>>::pre_order_iterator>
                     (*(pre_order_iterator **)(this + 8),rhs);
  pRVar1 = ResultBuilder::setResultType(pRVar1,result);
  toString<kp::tree<htmlcxx2::HTML::Node,std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>>::pre_order_iterator>
            (&local_38,*(Catch **)(this + 8),value);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  toString<kp::tree<htmlcxx2::HTML::Node,std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>>::pre_order_iterator>
            (&local_68,local_18,value_00);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_68);
  __s = Internal::OperatorTraits<(Catch::Internal::Operator)1>::getName();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_89);
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }